

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O0

void __thiscall
RandomTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
::RandomTestData(RandomTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
                 *this,basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
                       *in_delim,size_t in_fixed_word_count,size_t in_fixed_word_length)

{
  size_t in_fixed_word_length_local;
  size_t in_fixed_word_count_local;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>
  *in_delim_local;
  RandomTestData<signed_char,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  *this_local;
  
  std::__cxx11::
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
  basic_string(&this->m_delim,in_delim);
  this->m_fixed_word_count = in_fixed_word_count;
  this->m_fixed_word_length = in_fixed_word_length;
  std::__cxx11::
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
  basic_string(&this->m_str);
  std::
  vector<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::allocator<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>_>
  ::vector(&this->m_tokens);
  populate(this);
  return;
}

Assistant:

RandomTestData(StringT in_delim, size_t in_fixed_word_count = 0, size_t in_fixed_word_length = 0)
		: m_delim{ in_delim },
		m_fixed_word_count{ in_fixed_word_count },
		m_fixed_word_length{ in_fixed_word_length } {
		populate();
	}